

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int ffcins(fitsfile *fptr,LONGLONG naxis1,LONGLONG naxis2,LONGLONG ninsert,LONGLONG bytepos,
          int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  size_t __n;
  LONGLONG LVar5;
  byte bVar6;
  FITSfile *pFVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long firstchar;
  bool bVar11;
  uchar buffer [10000];
  
  iVar1 = *status;
  if (naxis2 != 0 && iVar1 < 1) {
    pFVar7 = fptr->Fptr;
    bVar6 = (pFVar7->hdutype == 1) << 5;
    lVar4 = naxis1 + ninsert;
    if (lVar4 < 0x2711) {
      lVar2 = 0;
      lVar3 = 0;
      if (0 < ninsert) {
        lVar3 = ninsert;
      }
      for (; lVar3 != lVar2; lVar2 = lVar2 + 1) {
        buffer[lVar2] = bVar6;
      }
      lVar2 = bytepos + 1;
      lVar3 = pFVar7->heapstart + pFVar7->datastart;
      if (pFVar7->logfilesize < lVar3) {
        lVar3 = lVar3 + 0xb3f;
        pFVar7->logfilesize = lVar3 - lVar3 % 0xb40;
      }
      ffgtbb(fptr,naxis2,lVar2,naxis1 - bytepos,buffer + ninsert,status);
      fptr->Fptr->rowlength = lVar4;
      ffptbb(fptr,naxis2,lVar2,(naxis1 - bytepos) + ninsert,buffer,status);
      while (fptr->Fptr->rowlength = naxis1, 1 < naxis2) {
        naxis2 = naxis2 + -1;
        ffgtbb(fptr,naxis2,lVar2,naxis1,buffer + ninsert,status);
        fptr->Fptr->rowlength = lVar4;
        ffptbb(fptr,naxis2,lVar2,lVar4,buffer,status);
      }
    }
    else {
      lVar2 = ((naxis1 + 9999) - bytepos) / 10000;
      lVar10 = bytepos + lVar2 * 10000 + -9999;
      LVar5 = (naxis1 - lVar10) + 1;
      lVar3 = 0;
      if (0 < lVar2) {
        lVar3 = lVar2;
      }
      while (lVar3 != 0) {
        ffgtbb(fptr,naxis2,lVar10,LVar5,buffer,status);
        fptr->Fptr->rowlength = lVar4;
        ffptbb(fptr,naxis2,ninsert + lVar10,LVar5,buffer,status);
        pFVar7 = fptr->Fptr;
        pFVar7->rowlength = naxis1;
        lVar10 = lVar10 + -10000;
        LVar5 = 10000;
        lVar3 = lVar3 + -1;
      }
      lVar2 = (naxis1 + 9999) / 10000;
      LVar5 = naxis2;
      lVar3 = 0;
      if (0 < lVar2) {
        lVar3 = lVar2;
      }
      while (1 < LVar5) {
        LVar5 = LVar5 + -1;
        lVar10 = lVar3;
        lVar8 = naxis1 - (lVar2 * 10000 + -10000);
        lVar9 = lVar2 * 10000 + bytepos + -9999;
        while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
          ffgtbb(fptr,LVar5,lVar9,lVar8,buffer,status);
          fptr->Fptr->rowlength = lVar4;
          ffptbb(fptr,LVar5,ninsert + lVar9,lVar8,buffer,status);
          pFVar7 = fptr->Fptr;
          pFVar7->rowlength = naxis1;
          lVar9 = lVar9 + -10000;
          lVar8 = 10000;
        }
      }
      __n = 10000;
      if (ninsert < 10000) {
        __n = ninsert;
      }
      memset(buffer,(uint)bVar6,__n);
      lVar3 = (ninsert + 9999) / 10000;
      pFVar7->rowlength = lVar4;
      lVar4 = lVar3;
      if (lVar3 < 1) {
        lVar4 = 0;
      }
      lVar2 = 0;
      if (0 < naxis2) {
        lVar2 = naxis2;
      }
      for (lVar10 = 1; lVar8 = lVar4, lVar9 = ninsert + 10000 + lVar3 * -10000,
          firstchar = bytepos + 1, lVar10 != lVar2 + 1; lVar10 = lVar10 + 1) {
        while (lVar8 != 0) {
          ffptbb(fptr,lVar10,firstchar,lVar9,buffer,status);
          firstchar = firstchar + lVar9;
          lVar8 = lVar8 + -1;
          lVar9 = 10000;
        }
      }
      fptr->Fptr->rowlength = naxis1;
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffcins(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis1,     /* I - width of the table, in bytes             */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           LONGLONG ninsert,    /* I - number of bytes to insert in each row    */
           LONGLONG bytepos,    /* I - rel. position in row to insert bytes     */
           int *status)     /* IO - error status                            */
/*
 Insert 'ninsert' bytes into each row of the table at position 'bytepos'.
*/
{
    unsigned char buffer[10000], cfill;
    LONGLONG newlen, fbyte, nbytes, irow, nseg, ii;

    if (*status > 0)
        return(*status);

    if (naxis2 == 0)
        return(*status);  /* just return if there are 0 rows in the table */

    /* select appropriate fill value */
    if ((fptr->Fptr)->hdutype == ASCII_TBL)
        cfill = 32;                     /* ASCII tables use blank fill */
    else
        cfill = 0;    /* primary array and binary tables use zero fill */

    newlen = naxis1 + ninsert;

    if (newlen <= 10000)
    {
       /*******************************************************************
       CASE #1: optimal case where whole new row fits in the work buffer
       *******************************************************************/

        for (ii = 0; ii < ninsert; ii++)
            buffer[ii] = cfill;      /* initialize buffer with fill value */

        /* first move the trailing bytes (if any) in the last row */
        fbyte = bytepos + 1;
        nbytes = naxis1 - bytepos;
        /* If the last row hasn't yet been accessed in full, it's possible
           that logfilesize hasn't been updated to account for it (by way
           of an ffldrc call).  This could cause ffgtbb to return with an
           EOF error.  To prevent this, we must increase logfilesize here. 
        */
        if ((fptr->Fptr)->logfilesize < (fptr->Fptr)->datastart + 
                 (fptr->Fptr)->heapstart)
        {
            (fptr->Fptr)->logfilesize = (((fptr->Fptr)->datastart +
                 (fptr->Fptr)->heapstart + 2879)/2880)*2880;
        }
        
        ffgtbb(fptr, naxis2, fbyte, nbytes, &buffer[ninsert], status);
        (fptr->Fptr)->rowlength = newlen; /*  new row length */

        /* write the row (with leading fill bytes) in the new place */
        nbytes += ninsert;
        ffptbb(fptr, naxis2, fbyte, nbytes, buffer, status);
        (fptr->Fptr)->rowlength = naxis1;  /* reset to orig. value */

        /*  now move the rest of the rows */
        for (irow = naxis2 - 1; irow > 0; irow--)
        {
            /* read the row to be shifted (work backwards thru the table) */
            ffgtbb(fptr, irow, fbyte, naxis1, &buffer[ninsert], status);
            (fptr->Fptr)->rowlength = newlen; /* new row length */

            /* write the row (with the leading fill bytes) in the new place */
            ffptbb(fptr, irow, fbyte, newlen, buffer, status);
            (fptr->Fptr)->rowlength = naxis1; /* reset to orig value */
        }
    }
    else
    {
        /*****************************************************************
        CASE #2:  whole row doesn't fit in work buffer; move row in pieces
        ******************************************************************
        first copy the data, then go back and write fill into the new column
        start by copying the trailing bytes (if any) in the last row.     */

        nbytes = naxis1 - bytepos;
        nseg = (nbytes + 9999) / 10000;
        fbyte = (nseg - 1) * 10000 + bytepos + 1;
        nbytes = naxis1 - fbyte + 1;

        for (ii = 0; ii < nseg; ii++)
        {
            ffgtbb(fptr, naxis2, fbyte, nbytes, buffer, status);
            (fptr->Fptr)->rowlength =   newlen;  /* new row length */

            ffptbb(fptr, naxis2, fbyte + ninsert, nbytes, buffer, status);
            (fptr->Fptr)->rowlength =   naxis1; /* reset to orig value */

            fbyte -= 10000;
            nbytes = 10000;
        }

        /* now move the rest of the rows */
        nseg = (naxis1 + 9999) / 10000;
        for (irow = naxis2 - 1; irow > 0; irow--)
        {
          fbyte = (nseg - 1) * 10000 + bytepos + 1;
          nbytes = naxis1 - (nseg - 1) * 10000;
          for (ii = 0; ii < nseg; ii++)
          { 
            /* read the row to be shifted (work backwards thru the table) */
            ffgtbb(fptr, irow, fbyte, nbytes, buffer, status);
            (fptr->Fptr)->rowlength =   newlen;  /* new row length */

            /* write the row in the new place */
            ffptbb(fptr, irow, fbyte + ninsert, nbytes, buffer, status);
            (fptr->Fptr)->rowlength =   naxis1; /* reset to orig value */

            fbyte -= 10000;
            nbytes = 10000;
          }
        }

        /* now write the fill values into the new column */
        nbytes = minvalue(ninsert, 10000);
        memset(buffer, cfill, (size_t) nbytes); /* initialize with fill value */

        nseg = (ninsert + 9999) / 10000;
        (fptr->Fptr)->rowlength =  newlen;  /* new row length */

        for (irow = 1; irow <= naxis2; irow++)
        {
          fbyte = bytepos + 1;
          nbytes = ninsert - ((nseg - 1) * 10000);
          for (ii = 0; ii < nseg; ii++)
          {
            ffptbb(fptr, irow, fbyte, nbytes, buffer, status);
            fbyte += nbytes;
            nbytes = 10000;
          }
        }
        (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */
    }
    return(*status);
}